

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O1

void __thiscall EPoller::updateChannel(EPoller *this,ChannelPtr *channel)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  element_type *peVar3;
  int iVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  Logger local_1008;
  undefined1 local_30 [8];
  epoll_event event;
  int fd;
  
  event.data.fd = ((channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->fd_;
  uVar1 = (this->channels_)._M_h._M_bucket_count;
  uVar6 = (ulong)(long)event.data.fd % uVar1;
  p_Var7 = (this->channels_)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var7->_M_nxt, p_Var8 = p_Var7, event.data.fd != *(int *)&p_Var7->_M_nxt[1]._M_nxt))
  {
    while (p_Var7 = p_Var2, p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var8 = p_Var7, event.data.fd == *(int *)&p_Var2[1]._M_nxt)) goto LAB_0011c7d7;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0011c7d7:
  if ((p_Var8 != (__node_base_ptr)0x0) && (p_Var8->_M_nxt != (_Hash_node_base *)0x0)) {
    pmVar5 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->channels_,&event.data.fd);
    peVar3 = (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((pmVar5->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr != peVar3) {
      __assert_fail("channels_[fd] == channel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                    ,0x45,"void EPoller::updateChannel(ChannelPtr)");
    }
    event.events = 0;
    local_30._4_4_ = event.data.fd;
    local_30._0_4_ = peVar3->events_;
    iVar4 = epoll_ctl(this->epollfd_,3,event.data.fd,(epoll_event *)local_30);
    if (iVar4 < 0) {
      Logger::Logger(&local_1008,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                     ,0x4c);
      if (0xf < ((int)&local_1008 + 0xfa8) - (int)local_1008.impl_.stream_.buffer_.cur_) {
        builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"epoll_mod error",0xf);
        local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 0xf;
      }
      Logger::~Logger(&local_1008);
      std::
      _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->channels_)._M_h,&event.data);
    }
    return;
  }
  __assert_fail("channels_.find(fd) != channels_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                ,0x44,"void EPoller::updateChannel(ChannelPtr)");
}

Assistant:

void EPoller::updateChannel(ChannelPtr channel) {
    int fd = channel->fd();
    // LOG << "Epoll MOD fd = " << fd;
    
    assert(channels_.find(fd) != channels_.end());
    assert(channels_[fd] == channel);

    struct epoll_event event;
    memset(&event, 0, sizeof event);
    event.events = channel->events();
    event.data.fd = fd;
    if (epoll_ctl(epollfd_, EPOLL_CTL_MOD, fd, &event) < 0) {
        LOG << "epoll_mod error";
        channels_.erase(fd);
    }
}